

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_0::ProgramOutputTestGroup::init
          (ProgramOutputTestGroup *this,EVP_PKEY_CTX *ctx)

{
  ContextType type;
  GLSLVersion glslVersion;
  int extraout_EAX;
  TestNode *pTVar1;
  
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  glslVersion = glu::getContextTypeGLSLVersion(type);
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "resource_list","Resource list");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  generateProgramInputOutputShaderCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar1,glslVersion,true,false,
             generateProgramOutputResourceListBlockContents);
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"array_size",
             "Array size");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  generateProgramInputOutputShaderCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar1,glslVersion,false,false,
             generateProgramOutputBasicBlockContents<(deqp::gles31::Functional::ProgramResourcePropFlags)2>
            );
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"location",
             "Location");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  generateProgramInputOutputShaderCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar1,glslVersion,false,false,
             generateProgramOutputLocationBlockContents);
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"name_length",
             "Name length");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  generateProgramInputOutputShaderCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar1,glslVersion,false,false,
             generateProgramOutputBasicBlockContents<(deqp::gles31::Functional::ProgramResourcePropFlags)256>
            );
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "referenced_by","Reference by shader");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  generateProgramInputOutputReferencedByCases
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar1,STORAGE_OUT);
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"type","Type")
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  generateProgramInputOutputShaderCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar1,glslVersion,false,false,
             generateProgramOutputTypeBlockContents);
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"is_per_patch"
             ,"Is per patch");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  generateProgramInputOutputShaderCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar1,glslVersion,false,false,
             generateProgramOutputBasicBlockContents<(deqp::gles31::Functional::ProgramResourcePropFlags)131072>
            );
  return extraout_EAX;
}

Assistant:

void ProgramOutputTestGroup::init (void)
{
	const glu::GLSLVersion glslVersion = glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());

	// .resource_list
	{
		tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(m_testCtx, "resource_list", "Resource list");
		addChild(blockGroup);
		generateProgramInputOutputShaderCaseBlocks(m_context, blockGroup, glslVersion, true, false, generateProgramOutputResourceListBlockContents);
	}

	// .array_size
	{
		tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(m_testCtx, "array_size", "Array size");
		addChild(blockGroup);
		generateProgramInputOutputShaderCaseBlocks(m_context, blockGroup, glslVersion, false, false, generateProgramOutputBasicBlockContents<PROGRAMRESOURCEPROP_ARRAY_SIZE>);
	}

	// .location
	{
		tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(m_testCtx, "location", "Location");
		addChild(blockGroup);
		generateProgramInputOutputShaderCaseBlocks(m_context, blockGroup, glslVersion, false, false, generateProgramOutputLocationBlockContents);
	}

	// .name_length
	{
		tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(m_testCtx, "name_length", "Name length");
		addChild(blockGroup);
		generateProgramInputOutputShaderCaseBlocks(m_context, blockGroup, glslVersion, false, false, generateProgramOutputBasicBlockContents<PROGRAMRESOURCEPROP_NAME_LENGTH>);
	}

	// .referenced_by
	{
		tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(m_testCtx, "referenced_by", "Reference by shader");
		addChild(blockGroup);
		generateProgramInputOutputReferencedByCases(m_context, blockGroup, glu::STORAGE_OUT);
	}

	// .type
	{
		tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(m_testCtx, "type", "Type");
		addChild(blockGroup);
		generateProgramInputOutputShaderCaseBlocks(m_context, blockGroup, glslVersion, false, false, generateProgramOutputTypeBlockContents);
	}

	// .is_per_patch
	{
		tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(m_testCtx, "is_per_patch", "Is per patch");
		addChild(blockGroup);
		generateProgramInputOutputShaderCaseBlocks(m_context, blockGroup, glslVersion, false, false, generateProgramOutputBasicBlockContents<PROGRAMRESOURCEPROP_IS_PER_PATCH>);
	}
}